

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCMSegment.cpp
# Opt level: O2

void __thiscall
Storage::Disk::PCMSegmentEventSource::PCMSegmentEventSource
          (PCMSegmentEventSource *this,PCMSegmentEventSource *original)

{
  (this->segment_).super___shared_ptr<Storage::Disk::PCMSegment,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->segment_).super___shared_ptr<Storage::Disk::PCMSegment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->next_event_).length.length = 0;
  (this->next_event_).length.clock_rate = 1;
  Numeric::LFSR<unsigned_long,_9223372036854782434UL>::LFSR(&this->lfsr_);
  std::__shared_ptr<Storage::Disk::PCMSegment,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<Storage::Disk::PCMSegment,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<Storage::Disk::PCMSegment,_(__gnu_cxx::_Lock_policy)2> *)original);
  (this->next_event_).length.clock_rate =
       (((this->segment_).super___shared_ptr<Storage::Disk::PCMSegment,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->length_of_a_bit).clock_rate;
  this->bit_pointer_ = 0;
  (this->next_event_).type = FluxTransition;
  return;
}

Assistant:

PCMSegmentEventSource::PCMSegmentEventSource(const PCMSegmentEventSource &original) {
	// share underlying data with the original
	segment_ = original.segment_;

	// load up the clock rate and set initial conditions
	next_event_.length.clock_rate = segment_->length_of_a_bit.clock_rate;
	reset();
}